

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::
ApplyVar<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
::ApplyVar(ApplyVar<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
           *this,ApplyFunc *func,VariableP<tcu::Vector<float,_3>_> *arg0,
          VariableP<tcu::Vector<float,_3>_> *arg1,VariableP<float> *arg2,
          VariableP<deqp::gls::BuiltinPrecisionTests::Void> *arg3)

{
  ExprP<deqp::gls::BuiltinPrecisionTests::Void> local_88;
  ExprP<float> local_78 [2];
  ExprP<tcu::Vector<float,_3>_> local_58;
  ExprP<tcu::Vector<float,_3>_> local_48;
  VariableP<deqp::gls::BuiltinPrecisionTests::Void> *local_38;
  VariableP<deqp::gls::BuiltinPrecisionTests::Void> *arg3_local;
  VariableP<float> *arg2_local;
  VariableP<tcu::Vector<float,_3>_> *arg1_local;
  VariableP<tcu::Vector<float,_3>_> *arg0_local;
  ApplyFunc *func_local;
  ApplyVar<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  
  local_38 = arg3;
  arg3_local = (VariableP<deqp::gls::BuiltinPrecisionTests::Void> *)arg2;
  arg2_local = (VariableP<float> *)arg1;
  arg1_local = arg0;
  arg0_local = (VariableP<tcu::Vector<float,_3>_> *)func;
  func_local = (ApplyFunc *)this;
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)&local_48);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)&local_58);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)local_78);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)&local_88);
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Apply(&this->
           super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
          ,func,&local_48,&local_58,local_78,&local_88);
  ExprP<deqp::gls::BuiltinPrecisionTests::Void>::~ExprP(&local_88);
  ExprP<float>::~ExprP(local_78);
  ExprP<tcu::Vector<float,_3>_>::~ExprP(&local_58);
  ExprP<tcu::Vector<float,_3>_>::~ExprP(&local_48);
  (this->
  super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ).super_Expr<tcu::Vector<float,_3>_>.super_ExprBase._vptr_ExprBase =
       (_func_int **)&PTR__ApplyVar_032c7b48;
  return;
}

Assistant:

ApplyVar	(const ApplyFunc&			func,
									 const VariableP<Arg0>&		arg0,
									 const VariableP<Arg1>&		arg1,
									 const VariableP<Arg2>&		arg2,
									 const VariableP<Arg3>&		arg3)
							: Apply<Sig> (func, arg0, arg1, arg2, arg3) {}